

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_return_double_value_constraint(double value_to_return)

{
  Constraint *pCVar1;
  double in_XMM0_Qa;
  Constraint *constraint;
  CgreenValue local_28;
  Constraint *local_10;
  double local_8;
  
  local_8 = in_XMM0_Qa;
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_RETURN_VALUE_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = test_true;
  pCVar1->name = "return value";
  local_10 = pCVar1;
  make_cgreen_double_value(&local_28,local_8);
  (pCVar1->expected_value).type = local_28.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_28._4_4_;
  (pCVar1->expected_value).value = local_28.value;
  (pCVar1->expected_value).value_size = local_28.value_size;
  return local_10;
}

Assistant:

Constraint *create_return_double_value_constraint(double value_to_return) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_RETURN_VALUE_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &test_true;
    constraint->name = "return value";
    constraint->expected_value = make_cgreen_double_value(value_to_return);

    return constraint;
}